

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectation
          (ScriptValidator *this,Location *loc,TypeVector *result_types,ConstVector *expected,
          char *desc)

{
  pointer pCVar1;
  Location *loc_00;
  pointer pCVar2;
  ulong uVar3;
  TypeVector actual_types;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  Location *local_40;
  Type local_38;
  
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = (expected->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (expected->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = loc;
  if (pCVar2 != pCVar1) {
    do {
      local_38 = pCVar2->type_;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                (&local_58,&local_38);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar1);
  }
  loc_00 = local_40;
  if ((long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        CheckTypeIndex(this,loc_00,
                       local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3],
                       (result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar3],"action",(Index)uVar3,
                       "result");
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_58.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_58.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    PrintError(this,local_40,"expected %zd results, got %zd");
  }
  if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}